

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::CommissionerSafe::GetRawActiveDataset
          (Error *__return_storage_ptr__,CommissionerSafe *this,ByteArray *aRawDataset,
          uint16_t aDatasetFlags)

{
  promise<ot::commissioner::Error> local_90;
  function<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_ot::commissioner::Error)>
  local_70;
  undefined1 local_50 [8];
  anon_class_16_2_ea3fa04d wait;
  promise<ot::commissioner::Error> pro;
  uint16_t aDatasetFlags_local;
  ByteArray *aRawDataset_local;
  CommissionerSafe *this_local;
  
  std::promise<ot::commissioner::Error>::promise
            ((promise<ot::commissioner::Error> *)&wait.aRawDataset);
  local_50 = (undefined1  [8])&wait.aRawDataset;
  wait.pro = (promise<ot::commissioner::Error> *)aRawDataset;
  std::
  function<void(std::vector<unsigned_char,std::allocator<unsigned_char>>const*,ot::commissioner::Error)>
  ::
  function<ot::commissioner::CommissionerSafe::GetRawActiveDataset(std::vector<unsigned_char,std::allocator<unsigned_char>>&,unsigned_short)::__0&,void>
            ((function<void(std::vector<unsigned_char,std::allocator<unsigned_char>>const*,ot::commissioner::Error)>
              *)&local_70,(anon_class_16_2_ea3fa04d *)local_50);
  (*(this->super_Commissioner)._vptr_Commissioner[0x1b])(this,&local_70,(ulong)aDatasetFlags);
  std::
  function<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_ot::commissioner::Error)>
  ::~function(&local_70);
  std::promise<ot::commissioner::Error>::get_future(&local_90);
  std::future<ot::commissioner::Error>::get
            (__return_storage_ptr__,(future<ot::commissioner::Error> *)&local_90);
  std::future<ot::commissioner::Error>::~future((future<ot::commissioner::Error> *)&local_90);
  std::promise<ot::commissioner::Error>::~promise
            ((promise<ot::commissioner::Error> *)&wait.aRawDataset);
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerSafe::GetRawActiveDataset(ByteArray &aRawDataset, uint16_t aDatasetFlags)
{
    std::promise<Error> pro;
    auto                wait = [&pro, &aRawDataset](const ByteArray *rawDataset, Error error) {
        if (rawDataset != nullptr)
        {
            aRawDataset = *rawDataset;
        }
        pro.set_value(error);
    };

    GetRawActiveDataset(wait, aDatasetFlags);
    return pro.get_future().get();
}